

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-repo.c
# Opt level: O0

int on_interest(uint8_t *interest,uint32_t interest_size,void *userdata)

{
  size_t sVar1;
  char *str;
  ndn_encoder_t encoder;
  ndn_data_t data;
  ndn_interest_t interest_pkt;
  void *userdata_local;
  uint32_t interest_size_local;
  uint8_t *interest_local;
  
  ndn_interest_from_block
            ((ndn_interest_t *)(data.signature.validity_period.not_after + 9),interest,interest_size
            );
  printf("On interest: \n");
  ndn_name_print((ndn_name_t *)(data.signature.validity_period.not_after + 9));
  memcpy(&encoder.output_max_size,data.signature.validity_period.not_after + 9,0x1bc);
  sVar1 = strlen("I\'m a Data packet.");
  ndn_data_set_content
            ((ndn_data_t *)&encoder.output_max_size,(uint8_t *)"I\'m a Data packet.",(uint32_t)sVar1
            );
  ndn_metainfo_init((ndn_metainfo_t *)&data.name.components_size);
  ndn_metainfo_set_content_type((ndn_metainfo_t *)&data.name.components_size,'\0');
  ndn_metainfo_set_freshness_period((ndn_metainfo_t *)&data.name.components_size,10000);
  encoder_init((ndn_encoder_t *)&str,buf,0x1000);
  ndn_data_tlv_encode_digest_sign((ndn_encoder_t *)&str,(ndn_data_t *)&encoder.output_max_size);
  ndn_forwarder_put_data((uint8_t *)str,(ulong)encoder.output_value._4_4_);
  return 0;
}

Assistant:

int
on_interest(const uint8_t* interest, uint32_t interest_size, void* userdata)
{
  ndn_interest_t interest_pkt;
  ndn_interest_from_block(&interest_pkt, interest, interest_size);
  ndn_data_t data;
  ndn_encoder_t encoder;
  char * str = "I'm a Data packet.";

  printf("On interest: \n");
  ndn_name_print(&interest_pkt.name);
  data.name = interest_pkt.name;
  ndn_data_set_content(&data, (uint8_t*)str, strlen(str));
  ndn_metainfo_init(&data.metainfo);
  ndn_metainfo_set_content_type(&data.metainfo, NDN_CONTENT_TYPE_BLOB);
  ndn_metainfo_set_freshness_period(&data.metainfo, 10000);
  encoder_init(&encoder, buf, 4096);
  ndn_data_tlv_encode_digest_sign(&encoder, &data);
  ndn_forwarder_put_data(encoder.output_value, encoder.offset);

  return NDN_FWD_STRATEGY_SUPPRESS;
}